

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O2

bool __thiscall EncodedS2LaxPolygonShape::Init(EncodedS2LaxPolygonShape *this,Decoder *decoder)

{
  uchar uVar1;
  bool bVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uint32 num_loops;
  uint32 local_14;
  
  local_14 = (uint32)((ulong)in_RAX >> 0x20);
  sVar3 = Decoder::avail(decoder);
  if (((sVar3 != 0) && (uVar1 = *decoder->buf_, decoder->buf_ = decoder->buf_ + 1, uVar1 == '\x01'))
     && (bVar2 = Decoder::get_varint32(decoder,&local_14), bVar2)) {
    *(uint32 *)&(this->super_S2Shape).field_0xc = local_14;
    bVar2 = s2coding::EncodedS2PointVector::Init(&this->vertices_,decoder);
    if ((bVar2) &&
       ((*(int *)&(this->super_S2Shape).field_0xc < 2 ||
        (bVar2 = s2coding::EncodedUintVector<unsigned_int>::Init
                           (&this->cumulative_vertices_,decoder), bVar2)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EncodedS2LaxPolygonShape::Init(Decoder* decoder) {
  if (decoder->avail() < 1) return false;
  uint8 version = decoder->get8();
  if (version != kCurrentEncodingVersionNumber) return false;

  uint32 num_loops;
  if (!decoder->get_varint32(&num_loops)) return false;
  num_loops_ = num_loops;

  if (!vertices_.Init(decoder)) return false;

  if (num_loops_ > 1) {
    if (!cumulative_vertices_.Init(decoder)) return false;
  }
  return true;
}